

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XprHelper.h
# Opt level: O3

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,-1,1,false>const,-1,1,false>const>>,3,0>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1,1,false>const,_1,1,false>const>>
                 (redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
                  *eval,scalar_sum_op<double,_double> *func,
                 CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
                 *xpr)

{
  ulong uVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  Scalar SVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  uVar1 = (xpr->m_xpr).
          super_BlockImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>,_0>
          .m_rows.m_value;
  uVar8 = uVar1 + 3;
  if (-1 < (long)uVar1) {
    uVar8 = uVar1;
  }
  pdVar2 = (eval->
           super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
           ).
           super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_double>
           .m_d.argImpl.
           super_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
           .
           super_block_evaluator<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
           .
           super_mapbase_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
           .m_data;
  if (uVar1 + 1 < 3) {
    return *pdVar2 * *pdVar2;
  }
  uVar7 = uVar1 - ((long)uVar1 >> 0x3f) & 0xfffffffffffffffe;
  dVar13 = *pdVar2 * *pdVar2;
  dVar14 = pdVar2[1] * pdVar2[1];
  if (3 < (long)uVar1) {
    uVar8 = uVar8 & 0xfffffffffffffffc;
    dVar10 = pdVar2[2] * pdVar2[2];
    dVar12 = pdVar2[3] * pdVar2[3];
    if (7 < uVar1) {
      lVar9 = 4;
      do {
        dVar3 = pdVar2[lVar9];
        dVar4 = (pdVar2 + lVar9)[1];
        dVar5 = pdVar2[lVar9 + 2];
        dVar6 = (pdVar2 + lVar9 + 2)[1];
        dVar13 = dVar13 + dVar3 * dVar3;
        dVar14 = dVar14 + dVar4 * dVar4;
        dVar10 = dVar10 + dVar5 * dVar5;
        dVar12 = dVar12 + dVar6 * dVar6;
        lVar9 = lVar9 + 4;
      } while (lVar9 < (long)uVar8);
    }
    dVar13 = dVar10 + dVar13;
    dVar14 = dVar12 + dVar14;
    if ((long)uVar8 < (long)uVar7) {
      dVar10 = pdVar2[uVar8];
      dVar12 = (pdVar2 + uVar8)[1];
      dVar13 = dVar13 + dVar10 * dVar10;
      dVar14 = dVar14 + dVar12 * dVar12;
    }
  }
  SVar11 = dVar14 + dVar13;
  if ((long)uVar7 < (long)uVar1) {
    do {
      SVar11 = SVar11 + pdVar2[uVar7] * pdVar2[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
  return SVar11;
}

Assistant:

explicit variable_if_dynamic(T value = 0) EIGEN_NO_THROW : m_value(value) {}